

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
libcellml::Analyser::AnalyserImpl::analyseComponent(AnalyserImpl *this,ComponentPtr *component)

{
  IssueImpl *this_00;
  size_type sVar1;
  element_type *peVar2;
  bool bVar3;
  element_type *peVar4;
  size_t sVar5;
  ulong uVar6;
  string local_f0;
  IssuePtr issue;
  AnalyserInternalEquationPtr internalEquation;
  XmlNodePtr node;
  AnalyserInternalVariablePtr internalVariable;
  VariablePtr variable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Component::math_abi_cxx11_
            (&local_f0,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  sVar1 = local_f0._M_string_length;
  std::__cxx11::string::~string((string *)&local_f0);
  if (sVar1 != 0) {
    Component::math_abi_cxx11_
              (&local_f0,
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    multiRootXml((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  *)&internalVariable,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    for (peVar4 = internalVariable.
                  super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar4 != (element_type *)
                  internalVariable.
                  super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi; peVar4 = (element_type *)&peVar4->mInitialisingVariable) {
      XmlDoc::rootNode((XmlDoc *)&local_f0);
      XmlNode::firstChild((XmlNode *)&node);
      while( true ) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        if (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) break;
        bVar3 = XmlNode::isMathmlElement
                          (node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(char *)0x0);
        if (bVar3) {
          AnalyserInternalEquation::create((AnalyserInternalEquation *)&internalEquation,component);
          std::
          vector<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
          ::push_back(&this->mInternalEquations,(value_type *)&internalEquation);
          peVar2 = internalEquation.
                   super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          AnalyserEquationAst::parent((AnalyserEquationAst *)&local_f0);
          analyseNode(this,&node,&peVar2->mAst,(AnalyserEquationAstPtr *)&local_f0,component,
                      &internalEquation);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
          if ((((internalEquation.
                 super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mAst).
               super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->mPimpl->mType != EQUALITY) {
            Issue::IssueImpl::create();
            this_00 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->mPimpl;
            expression_abi_cxx11_
                      ((string *)&variable,this,
                       &(internalEquation.
                         super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->mAst,true);
            std::operator+(&local_50,"Equation ",(string *)&variable);
            std::operator+(&local_f0,&local_50," is not an equality statement (i.e. LHS = RHS).");
            Issue::IssueImpl::setDescription(this_00,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&variable);
            Issue::IssueImpl::setReferenceRule
                      ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
            AnyCellmlElement::AnyCellmlElementImpl::setComponent
                      ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,component,COMPONENT);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&internalEquation.
                      super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        XmlNode::next((XmlNode *)&local_f0);
        std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&local_f0);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               *)&internalVariable);
  }
  uVar6 = 0;
  while( true ) {
    sVar5 = Component::variableCount
                      ((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (sVar5 <= uVar6) break;
    Component::variable((Component *)&variable,
                        (size_t)(component->
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    AnalyserImpl::internalVariable((AnalyserImpl *)&internalVariable,(VariablePtr *)this);
    Variable::initialValue_abi_cxx11_
              (&local_f0,
               variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_f0._M_string_length == 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      Variable::initialValue_abi_cxx11_
                (&local_50,
                 ((internalVariable.
                   super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->mVariable).
                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      sVar1 = local_50._M_string_length;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_f0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        AnalyserInternalVariable::setVariable
                  (internalVariable.
                   super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&variable,true);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&internalVariable.
                super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    sVar5 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar5 <= uVar6) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_f0,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    analyseComponent(this,(ComponentPtr *)&local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::analyseComponent(const ComponentPtr &component)
{
    // Retrieve the math string associated with the given component and analyse
    // it, one equation at a time, keeping in mind that it may consist of
    // several <math> elements, hence our use of multiRootXml().

    if (!component->math().empty()) {
        for (const auto &doc : multiRootXml(component->math())) {
            for (auto node = doc->rootNode()->firstChild(); node != nullptr; node = node->next()) {
                if (node->isMathmlElement()) {
                    // Create and keep track of the equation associated with the
                    // given node.

                    auto internalEquation = AnalyserInternalEquation::create(component);

                    mInternalEquations.push_back(internalEquation);

                    // Actually analyse the node.
                    // Note: we must not test internalEquation->mAst->parent()
                    //       since if it is equal to nullptr then a parent will
                    //       be created by analyseNode().

                    analyseNode(node, internalEquation->mAst, internalEquation->mAst->parent(), component, internalEquation);

                    // Make sure that our internal equation is an equality
                    // statement.

                    if (internalEquation->mAst->mPimpl->mType != AnalyserEquationAst::Type::EQUALITY) {
                        auto issue = Issue::IssueImpl::create();

                        issue->mPimpl->setDescription("Equation " + expression(internalEquation->mAst)
                                                      + " is not an equality statement (i.e. LHS = RHS).");
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
                        issue->mPimpl->mItem->mPimpl->setComponent(component);

                        addIssue(issue);
                    }
                }
            }
        }
    }

    // Go through the given component's variables and internally keep track of
    // the ones that have an initial value.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        // If `variable` has an initial value and the variable held by
        // `internalVariable` doesn't, then replace the variable held by
        // `internalVariable`.

        auto variable = component->variable(i);
        auto internalVariable = Analyser::AnalyserImpl::internalVariable(variable);

        if (!variable->initialValue().empty()
            && internalVariable->mVariable->initialValue().empty()) {
            internalVariable->setVariable(variable);
        }
    }

    // Do the same for the components encapsulated by the given component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        analyseComponent(component->component(i));
    }
}